

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int session_end(SESSION_HANDLE session,char *condition_value,char *description)

{
  int iVar1;
  ERROR_HANDLE error;
  int iVar2;
  ulong uVar3;
  
  if (session == (SESSION_HANDLE)0x0) {
    return 0x38c;
  }
  iVar2 = 0;
  if ((session->session_state == SESSION_STATE_UNMAPPED) ||
     (iVar2 = 0, session->session_state == SESSION_STATE_DISCARDING)) goto LAB_00116805;
  if (condition_value == (char *)0x0) {
    error = (ERROR_HANDLE)0x0;
LAB_001167d0:
    iVar1 = send_end_frame(session,error);
    iVar2 = 0x3ad;
    if (iVar1 == 0) {
      session_set_state(session,SESSION_STATE_DISCARDING);
      iVar2 = 0;
    }
    if (error == (ERROR_HANDLE)0x0) goto LAB_00116805;
  }
  else {
    error = error_create(condition_value);
    if (error == (ERROR_HANDLE)0x0) {
      iVar2 = 0x39e;
      goto LAB_00116805;
    }
    iVar1 = error_set_description(error,description);
    iVar2 = 0x3a4;
    if (iVar1 == 0) goto LAB_001167d0;
  }
  error_destroy(error);
LAB_00116805:
  for (uVar3 = 0; uVar3 < session->link_endpoint_count; uVar3 = uVar3 + 1) {
    free_link_endpoint(session->link_endpoints[uVar3]);
  }
  session->link_endpoint_count = 0;
  return iVar2;
}

Assistant:

int session_end(SESSION_HANDLE session, const char* condition_value, const char* description)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;
        size_t i;

        if ((session_instance->session_state != SESSION_STATE_UNMAPPED) &&
            (session_instance->session_state != SESSION_STATE_DISCARDING))
        {
            ERROR_HANDLE error_handle = NULL;
            result = 0;

            if (condition_value != NULL)
            {
                error_handle = error_create(condition_value);
                if (error_handle == NULL)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    if (error_set_description(error_handle, description) != 0)
                    {
                        result = MU_FAILURE;
                    }
                }
            }

            if (result == 0)
            {
                if (send_end_frame(session_instance, error_handle) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    session_set_state(session_instance, SESSION_STATE_DISCARDING);
                    result = 0;
                }
            }

            if (error_handle != NULL)
            {
                error_destroy(error_handle);
            }
        }
        else
        {
            result = 0;
        }

        // all link endpoints are destroyed when the session end happens
        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            free_link_endpoint(session_instance->link_endpoints[i]);
        }

        session_instance->link_endpoint_count = 0;
    }

    return result;
}